

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void set_cb(Fl_Button *param_1,void *param_2)

{
  Fl_Widget *this;
  uint uVar1;
  int iVar2;
  Fl_Widget **ppFVar3;
  Fl_Widget *o;
  Fl_Widget **ppFStack_20;
  int i;
  Fl_Widget **a;
  void *param_1_local;
  Fl_Button *param_0_local;
  
  haderror = 0;
  ppFStack_20 = Fl_Group::array(&the_panel->super_Fl_Group);
  o._4_4_ = Fl_Group::children(&the_panel->super_Fl_Group);
  while( true ) {
    do {
      iVar2 = o._4_4_ + -1;
      if (o._4_4_ == 0) {
        return;
      }
      ppFVar3 = ppFStack_20 + 1;
      this = *ppFStack_20;
      uVar1 = Fl_Widget::changed(this);
      o._4_4_ = iVar2;
      ppFStack_20 = ppFVar3;
    } while (uVar1 == 0);
    Fl_Widget::do_callback(this);
    if (haderror != 0) break;
    Fl_Widget::clear_changed(this);
  }
  return;
}

Assistant:

void set_cb(Fl_Button*, void*) {
  haderror = 0;
  Fl_Widget*const* a = the_panel->array();
  for (int i=the_panel->children(); i--;) {
    Fl_Widget* o = *a++;
    if (o->changed()) {
      o->do_callback();
      if (haderror) return;
      o->clear_changed();
    }
  }
}